

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O0

CURLcode run_all_transfers(GlobalConfig *global,CURLSH *share,CURLcode result)

{
  CURLcode CVar1;
  CURLcode result2;
  long delay;
  per_transfer *ppStack_28;
  _Bool retry;
  per_transfer *per;
  _Bool orig_isatty;
  _Bool orig_noprogress;
  CURLSH *pCStack_18;
  CURLcode result_local;
  CURLSH *share_local;
  GlobalConfig *global_local;
  
  per._3_1_ = (*(ushort *)&global->field_0x63 >> 9 & 1) != 0;
  per._2_1_ = (*(ushort *)&global->field_0x63 >> 10 & 1) != 0;
  per._4_4_ = result;
  pCStack_18 = share;
  share_local = global;
  if (result == CURLE_OK) {
    if ((*(ushort *)&global->field_0x63 & 1) == 0) {
      per._4_4_ = serial_transfers(global,share);
    }
    else {
      per._4_4_ = parallel_transfers(global,share);
    }
  }
  for (ppStack_28 = transfers; ppStack_28 != (per_transfer *)0x0;
      ppStack_28 = del_per_transfer(ppStack_28)) {
    CVar1 = post_per_transfer((GlobalConfig *)share_local,ppStack_28,per._4_4_,
                              (_Bool *)((long)&delay + 7),(long *)&stack0xffffffffffffffc8);
    if (per._4_4_ == CURLE_OK) {
      per._4_4_ = CVar1;
    }
    clean_getout(ppStack_28->config);
  }
  *(ushort *)((long)share_local + 99) =
       *(ushort *)((long)share_local + 99) & 0xfdff | (ushort)(per._3_1_ & 1) << 9;
  *(ushort *)((long)share_local + 99) =
       *(ushort *)((long)share_local + 99) & 0xfbff | (ushort)(per._2_1_ & 1) << 10;
  return per._4_4_;
}

Assistant:

static CURLcode run_all_transfers(struct GlobalConfig *global,
                                  CURLSH *share,
                                  CURLcode result)
{
  /* Save the values of noprogress and isatty to restore them later on */
  bool orig_noprogress = global->noprogress;
  bool orig_isatty = global->isatty;
  struct per_transfer *per;

  /* Time to actually do the transfers */
  if(!result) {
    if(global->parallel)
      result = parallel_transfers(global, share);
    else
      result = serial_transfers(global, share);
  }

  /* cleanup if there are any left */
  for(per = transfers; per;) {
    bool retry;
    long delay;
    CURLcode result2 = post_per_transfer(global, per, result, &retry, &delay);
    if(!result)
      /* do not overwrite the original error */
      result = result2;

    /* Free list of given URLs */
    clean_getout(per->config);

    per = del_per_transfer(per);
  }

  /* Reset the global config variables */
  global->noprogress = orig_noprogress;
  global->isatty = orig_isatty;


  return result;
}